

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O1

int __thiscall
qclab::io::QASMFile::
parse1a<qclab::qgates::RotationZ<std::complex<double>>,qclab::QObject<std::complex<double>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
          *gate)

{
  pointer pcVar1;
  QObject<std::complex<double>_> *pQVar2;
  int iVar3;
  string *psVar4;
  QRotationGate1<std::complex<double>_> *this_00;
  bool bVar5;
  long *local_88;
  size_t local_80;
  long local_78 [2];
  double local_68;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  *local_60;
  size_type local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_58 = (this->qregName_)._M_string_length;
  std::__cxx11::string::substr((ulong)&local_50,(ulong)command);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  local_60 = gate;
  if (local_48 == local_80) {
    if (local_48 == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp(local_50,local_88,local_48);
      bVar5 = iVar3 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  iVar3 = 0;
  if (bVar5) {
    psVar4 = (string *)std::__cxx11::string::erase((ulong)command,0);
    local_68 = parseAngle<double>(this,psVar4);
    psVar4 = (string *)std::__cxx11::string::erase((ulong)command,0);
    iVar3 = parseQubit(this,psVar4);
    this_00 = (QRotationGate1<std::complex<double>_> *)operator_new(0x20);
    qgates::QRotationGate1<std::complex<double>_>::QRotationGate1(this_00,iVar3,local_68,false);
    (this_00->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
         (QObject<std::complex<double>_>)&PTR_nbQubits_001340f8;
    pQVar2 = (local_60->_M_t).
             super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl;
    (local_60->_M_t).
    super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl =
         (QObject<std::complex<double>_> *)this_00;
    iVar3 = 1;
    if (pQVar2 != (QObject<std::complex<double>_> *)0x0) {
      (*pQVar2->_vptr_QObject[0xd])();
    }
  }
  return iVar3;
}

Assistant:

int parse1a( std::string name , std::string& command ,
                   std::unique_ptr< GATE >& gate ) const {
        using T = typename G::value_type ;
        using R = qclab::real_t< T > ;
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + 1 ) == name + "(" ) {
          const auto angle = parseAngle< R >( command.erase( 0 , n1 + 1 ) ) ;
          const auto qubit = parseQubit(      command.erase( 0 , n2 + 1 ) ) ;
          gate = std::make_unique< G >( qubit , angle ) ;
          return 1 ;
        }
        return 0 ;
      }